

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsModuleCompiler::AddExport(AsmJsModuleCompiler *this,PropertyName name,RegSlot location)

{
  bool bVar1;
  int iVar2;
  PropertyId local_38;
  RegSlot local_34;
  AsmJsModuleExport ex;
  AsmJsModuleExport *foundExport;
  
  local_38 = name->m_propertyId;
  bVar1 = JsUtil::
          BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>(&this->mExports,&local_38,(AsmJsModuleExport **)&ex);
  if (bVar1) {
    AsmJSCompiler::OutputMessage
              (this->mCx->scriptContext,DEIT_GENERAL,L"Warning: redefining export");
    *(RegSlot *)((long)ex + 4) = location;
    bVar1 = true;
  }
  else {
    local_38 = name->m_propertyId;
    local_34 = location;
    iVar2 = JsUtil::
            BaseDictionary<int,Js::AsmJsModuleCompiler::AsmJsModuleExport,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::
            Insert<(JsUtil::BaseDictionary<int,Js::AsmJsModuleCompiler::AsmJsModuleExport,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                      ((BaseDictionary<int,Js::AsmJsModuleCompiler::AsmJsModuleExport,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)&this->mExports,&local_38,(AsmJsModuleExport *)&local_38);
    bVar1 = -1 < iVar2;
  }
  return bVar1;
}

Assistant:

bool AsmJsModuleCompiler::AddExport(PropertyName name, RegSlot location)
    {
        AsmJsModuleExport * foundExport;
        if (mExports.TryGetReference(name->GetPropertyId(), &foundExport))
        {
            AsmJSCompiler::OutputMessage(GetScriptContext(), DEIT_GENERAL, _u("Warning: redefining export"));
            foundExport->location = location;
            return true;
        }
        else
        {
            AsmJsModuleExport ex;
            ex.id = name->GetPropertyId();
            ex.location = location;
            return mExports.Add(ex.id, ex) >= 0;
            // return is < 0 if count overflowed 31bits
        }
    }